

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O0

void __thiscall ClassBundle::upgradeScopes(ClassBundle *this)

{
  bool bVar1;
  reference pCVar2;
  reference field_00;
  Field *field;
  iterator __end2;
  iterator __begin2;
  vector<Field,_std::allocator<Field>_> *__range2;
  Class *cls;
  iterator __end1;
  iterator __begin1;
  vector<Class,_std::allocator<Class>_> *__range1;
  ClassBundle *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&this->unknownClasses);
  __end1 = std::vector<Class,_std::allocator<Class>_>::begin(&this->allClasses);
  cls = (Class *)std::vector<Class,_std::allocator<Class>_>::end(&this->allClasses);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                                *)&cls);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
             operator*(&__end1);
    __end2 = std::vector<Field,_std::allocator<Field>_>::begin(&pCVar2->fields);
    field = (Field *)std::vector<Field,_std::allocator<Field>_>::end(&pCVar2->fields);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>
                                  *)&field);
      if (!bVar1) break;
      field_00 = __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>
                 ::operator*(&__end2);
      updateField(this,field_00);
      __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void upgradeScopes() {
        this->unknownClasses.clear();
        for (auto& cls : this->allClasses) {
            for (auto& field : cls.fields) {
                this->updateField(field);
            }
        }

    }